

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

Texture * __thiscall nite::Texture::operator=(Texture *this,Texture *other)

{
  pointer *pppTVar1;
  int iVar2;
  iterator __position;
  float fVar3;
  float fVar4;
  float fVar5;
  pointer ptVar6;
  Texture *local_20;
  
  if (-1 < other->objectId) {
    unload(this);
    this->scale = other->scale;
    fVar3 = (other->region).y;
    fVar4 = (other->region).w;
    fVar5 = (other->region).h;
    (this->region).x = (other->region).x;
    (this->region).y = fVar3;
    (this->region).w = fVar4;
    (this->region).h = fVar5;
    this->smooth = other->smooth;
    this->objectId = other->objectId;
    std::__cxx11::string::_M_assign((string *)this);
    ptVar6 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->objectId;
    __position._M_current =
         textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
         super__Vector_impl_data._M_start[iVar2].owners.
         super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2].owners.
        super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_20 = this;
      std::vector<nite::Texture*,std::allocator<nite::Texture*>>::_M_realloc_insert<nite::Texture*>
                ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)
                 &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2].owners,__position,&local_20);
    }
    else {
      *__position._M_current = this;
      pppTVar1 = &ptVar6[iVar2].owners.
                  super__Vector_base<nite::Texture_*,_std::allocator<nite::Texture_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return this;
}

Assistant:

nite::Texture& nite::Texture::operator= (const nite::Texture &other){
	if(other.objectId <= -1) return *this;
	unload();
	scale = other.scale;
	region = other.region;
	smooth = other.smooth;
	objectId = other.objectId;
	filename = other.filename;
	textureList[objectId].owners.push_back(this);
	return *this;
}